

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

int32_t __thiscall
icu_63::MessagePattern::parseMessage
          (MessagePattern *this,int32_t index,int32_t msgStartLength,int32_t nestingLevel,
          UMessagePatternArgType parentType,UParseError *parseError,UErrorCode *errorCode)

{
  char16_t *pcVar1;
  short sVar2;
  int iVar3;
  char16_t cVar4;
  uint index_00;
  Part *pPVar5;
  int iVar6;
  char16_t *pcVar7;
  int start;
  uint uVar8;
  int iVar9;
  uint index_01;
  bool bVar10;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (nestingLevel < 0x8000) {
      iVar3 = this->partsLength;
      addPart(this,UMSGPAT_PART_TYPE_MSG_START,index,msgStartLength,nestingLevel,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        index_01 = msgStartLength + index;
        pcVar1 = (char16_t *)((long)&(this->msg).fUnion + 2);
        bVar10 = (parentType - UMSGPAT_ARG_TYPE_PLURAL & 0xfffffffd) == 0;
        do {
          sVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            uVar8 = (this->msg).fUnion.fFields.fLength;
          }
          else {
            uVar8 = (int)sVar2 >> 5;
          }
          if ((int)uVar8 <= (int)index_01) {
            if (nestingLevel < 1) {
              pPVar5 = (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>)
                       .a.ptr;
            }
            else if ((nestingLevel != 1 || parentType != UMSGPAT_ARG_TYPE_CHOICE) ||
                    (pPVar5 = (this->partsList->
                              super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr,
                    pPVar5->type == UMSGPAT_PART_TYPE_MSG_START)) {
              setParseError(this,parseError,0);
              *errorCode = U_UNMATCHED_BRACES;
              return 0;
            }
            pPVar5[iVar3].limitPartIndex = this->partsLength;
            addPart(this,UMSGPAT_PART_TYPE_MSG_LIMIT,index_01,0,nestingLevel,errorCode);
            return index_01;
          }
          index_00 = index_01 + 1;
          if (index_01 < uVar8) {
            pcVar7 = pcVar1;
            if (((int)sVar2 & 2U) == 0) {
              pcVar7 = (this->msg).fUnion.fFields.fArray;
            }
            cVar4 = pcVar7[(int)index_01];
            if (cVar4 == L'\'') {
              if (index_00 == uVar8) {
                addPart(this,UMSGPAT_PART_TYPE_INSERT_CHAR,uVar8,0,0x27,errorCode);
                this->needsAutoQuoting = '\x01';
                index_00 = uVar8;
              }
              else {
                cVar4 = L'\xffff';
                if ((index_00 < uVar8) && (cVar4 = pcVar7[(int)index_00], cVar4 == L'\'')) {
                  index_01 = index_01 + 2;
                }
                else {
                  uVar8 = index_00;
                  if ((this->aposMode != UMSGPAT_APOS_DOUBLE_REQUIRED) &&
                     (((cVar4 != L'{' && (cVar4 != L'}')) &&
                      ((cVar4 != L'#' || !bVar10) &&
                       (cVar4 != L'|' || parentType != UMSGPAT_ARG_TYPE_CHOICE))))) {
                    addPart(this,UMSGPAT_PART_TYPE_INSERT_CHAR,index_00,0,0x27,errorCode);
                    this->needsAutoQuoting = '\x01';
                    goto LAB_0028f374;
                  }
                  do {
                    addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,index_01,1,0,errorCode);
                    sVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
                    if ((int)uVar8 < -1) {
                      iVar9 = (this->msg).fUnion.fFields.fLength;
                      iVar6 = (int)sVar2 >> 5;
                      start = 0;
                    }
                    else {
                      iVar6 = (int)sVar2 >> 5;
                      iVar9 = (this->msg).fUnion.fFields.fLength;
                      start = iVar6;
                      if (sVar2 < 0) {
                        start = iVar9;
                      }
                      if ((int)(uVar8 + 1) <= start) {
                        start = uVar8 + 1;
                      }
                    }
                    if (sVar2 < 0) {
                      iVar6 = iVar9;
                    }
                    index_00 = UnicodeString::doIndexOf(&this->msg,L'\'',start,iVar6 - start);
                    if ((int)index_00 < 0) {
                      sVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
                      if (sVar2 < 0) {
                        index_00 = (this->msg).fUnion.fFields.fLength;
                      }
                      else {
                        index_00 = (int)sVar2 >> 5;
                      }
                      addPart(this,UMSGPAT_PART_TYPE_INSERT_CHAR,index_00,0,0x27,errorCode);
                      this->needsAutoQuoting = '\x01';
                      goto LAB_0028f374;
                    }
                    sVar2 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
                    if (sVar2 < 0) {
                      uVar8 = (this->msg).fUnion.fFields.fLength;
                    }
                    else {
                      uVar8 = (int)sVar2 >> 5;
                    }
                    index_01 = index_00 + 1;
                    if (uVar8 <= index_01) break;
                    pcVar7 = pcVar1;
                    if (((int)sVar2 & 2U) == 0) {
                      pcVar7 = (this->msg).fUnion.fFields.fArray;
                    }
                    uVar8 = index_01;
                  } while (pcVar7[index_01] == L'\'');
                }
                addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,index_00,1,0,errorCode);
                index_00 = index_01;
              }
            }
            else if (bVar10 && cVar4 == L'#') {
              addPart(this,UMSGPAT_PART_TYPE_REPLACE_NUMBER,index_01,1,0,errorCode);
            }
            else if (cVar4 == L'{') {
              index_00 = parseArg(this,index_01,1,nestingLevel,parseError,errorCode);
            }
            else if ((0 < nestingLevel && cVar4 == L'}') ||
                    (parentType == UMSGPAT_ARG_TYPE_CHOICE && cVar4 == L'|')) {
              if (parentType == UMSGPAT_ARG_TYPE_CHOICE) {
                index_00 = index_01;
              }
              (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr
              [iVar3].limitPartIndex = this->partsLength;
              addPart(this,UMSGPAT_PART_TYPE_MSG_LIMIT,index_01,
                      (uint)(parentType != UMSGPAT_ARG_TYPE_CHOICE || cVar4 != L'}'),nestingLevel,
                      errorCode);
              return index_00;
            }
          }
LAB_0028f374:
          index_01 = index_00;
        } while (*errorCode < U_ILLEGAL_ARGUMENT_ERROR);
      }
    }
    else {
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
  }
  return 0;
}

Assistant:

int32_t
MessagePattern::parseMessage(int32_t index, int32_t msgStartLength,
                             int32_t nestingLevel, UMessagePatternArgType parentType,
                             UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(nestingLevel>Part::MAX_VALUE) {
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    int32_t msgStart=partsLength;
    addPart(UMSGPAT_PART_TYPE_MSG_START, index, msgStartLength, nestingLevel, errorCode);
    index+=msgStartLength;
    for(;;) {  // while(index<msg.length()) with U_FAILURE(errorCode) check
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        if(index>=msg.length()) {
            break;
        }
        UChar c=msg.charAt(index++);
        if(c==u_apos) {
            if(index==msg.length()) {
                // The apostrophe is the last character in the pattern. 
                // Add a Part for auto-quoting.
                addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                        u_apos, errorCode);  // value=char to be inserted
                needsAutoQuoting=TRUE;
            } else {
                c=msg.charAt(index);
                if(c==u_apos) {
                    // double apostrophe, skip the second one
                    addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index++, 1, 0, errorCode);
                } else if(
                    aposMode==UMSGPAT_APOS_DOUBLE_REQUIRED ||
                    c==u_leftCurlyBrace || c==u_rightCurlyBrace ||
                    (parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_pipe) ||
                    (UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(parentType) && c==u_pound)
                ) {
                    // skip the quote-starting apostrophe
                    addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index-1, 1, 0, errorCode);
                    // find the end of the quoted literal text
                    for(;;) {
                        index=msg.indexOf(u_apos, index+1);
                        if(index>=0) {
                            if(/*(index+1)<msg.length() &&*/ msg.charAt(index+1)==u_apos) {
                                // double apostrophe inside quoted literal text
                                // still encodes a single apostrophe, skip the second one
                                addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, ++index, 1, 0, errorCode);
                            } else {
                                // skip the quote-ending apostrophe
                                addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index++, 1, 0, errorCode);
                                break;
                            }
                        } else {
                            // The quoted text reaches to the end of the of the message.
                            index=msg.length();
                            // Add a Part for auto-quoting.
                            addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                                    u_apos, errorCode);  // value=char to be inserted
                            needsAutoQuoting=TRUE;
                            break;
                        }
                    }
                } else {
                    // Interpret the apostrophe as literal text.
                    // Add a Part for auto-quoting.
                    addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                            u_apos, errorCode);  // value=char to be inserted
                    needsAutoQuoting=TRUE;
                }
            }
        } else if(UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(parentType) && c==u_pound) {
            // The unquoted # in a plural message fragment will be replaced
            // with the (number-offset).
            addPart(UMSGPAT_PART_TYPE_REPLACE_NUMBER, index-1, 1, 0, errorCode);
        } else if(c==u_leftCurlyBrace) {
            index=parseArg(index-1, 1, nestingLevel, parseError, errorCode);
        } else if((nestingLevel>0 && c==u_rightCurlyBrace) ||
                  (parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_pipe)) {
            // Finish the message before the terminator.
            // In a choice style, report the "}" substring only for the following ARG_LIMIT,
            // not for this MSG_LIMIT.
            int32_t limitLength=(parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_rightCurlyBrace) ? 0 : 1;
            addLimitPart(msgStart, UMSGPAT_PART_TYPE_MSG_LIMIT, index-1, limitLength,
                         nestingLevel, errorCode);
            if(parentType==UMSGPAT_ARG_TYPE_CHOICE) {
                // Let the choice style parser see the '}' or '|'.
                return index-1;
            } else {
                // continue parsing after the '}'
                return index;
            }
        }  // else: c is part of literal text
    }
    if(nestingLevel>0 && !inTopLevelChoiceMessage(nestingLevel, parentType)) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    addLimitPart(msgStart, UMSGPAT_PART_TYPE_MSG_LIMIT, index, 0, nestingLevel, errorCode);
    return index;
}